

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regex.h
# Opt level: O0

Location * __thiscall
trieste::REIterator::current(Location *__return_storage_ptr__,REIterator *this)

{
  const_pointer pcVar1;
  element_type *this_00;
  const_pointer pvVar2;
  string_view local_38;
  shared_ptr<trieste::SourceDef> local_28 [16];
  REIterator *local_18;
  REIterator *this_local;
  
  local_18 = this;
  this_local = (REIterator *)__return_storage_ptr__;
  std::shared_ptr<trieste::SourceDef>::shared_ptr(local_28,&this->source);
  pcVar1 = re2::StringPiece::data(&this->sp);
  this_00 = std::__shared_ptr_access<trieste::SourceDef,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<trieste::SourceDef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)this);
  local_38 = SourceDef::view(this_00);
  pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::data(&local_38);
  Location::Location(__return_storage_ptr__,(Source *)local_28,(long)pcVar1 - (long)pvVar2,1);
  std::shared_ptr<trieste::SourceDef>::~shared_ptr(local_28);
  return __return_storage_ptr__;
}

Assistant:

Location current() const
    {
      return {
        source, static_cast<size_t>(sp.data() - source->view().data()), 1};
    }